

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall flatbuffers::Parser::ParseHash(Parser *this,Value *e,FieldDef *field)

{
  bool bVar1;
  Value *pVVar2;
  HashFunction p_Var3;
  HashFunction p_Var4;
  char *pcVar5;
  HashFunction p_Var6;
  long in_RCX;
  string local_188;
  unsigned_long local_168;
  uint64_t hashed_value_5;
  HashFunction hash_5;
  unsigned_long local_138;
  int64_t hashed_value_4;
  HashFunction hash_4;
  uint local_104;
  HashFunction p_Stack_100;
  uint32_t hashed_value_3;
  HashFunction hash_3;
  uint local_d4;
  HashFunction p_Stack_d0;
  int32_t hashed_value_2;
  HashFunction hash_2;
  unsigned_short local_a2;
  HashFunction p_Stack_a0;
  uint16_t hashed_value_1;
  HashFunction hash_1;
  unsigned_short local_72;
  HashFunction p_Stack_70;
  int16_t hashed_value;
  HashFunction hash;
  allocator<char> local_51;
  string local_50;
  Value *local_30;
  Value *hash_name;
  FieldDef *field_local;
  Value *e_local;
  Parser *this_local;
  CheckedError *ce;
  
  field_local = field;
  e_local = e;
  this_local = this;
  if (in_RCX != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"hash",&local_51);
    pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                       ((SymbolTable<flatbuffers::Value> *)(in_RCX + 0x58),&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    local_30 = pVVar2;
    switch(*(undefined4 *)&(field_local->super_Definition).name) {
    case 5:
      pcVar5 = (char *)std::__cxx11::string::c_str();
      p_Var3 = FindHashFunction16(pcVar5);
      p_Stack_70 = p_Var3;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_72 = (*p_Var3)(pcVar5);
      NumToString<short>((string *)&hash_1,local_72);
      std::__cxx11::string::operator=
                ((string *)&(field_local->super_Definition).file,(string *)&hash_1);
      std::__cxx11::string::~string((string *)&hash_1);
      break;
    case 6:
      pcVar5 = (char *)std::__cxx11::string::c_str();
      p_Var3 = FindHashFunction16(pcVar5);
      p_Stack_a0 = p_Var3;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_a2 = (*p_Var3)(pcVar5);
      NumToString<unsigned_short>((string *)&hash_2,local_a2);
      std::__cxx11::string::operator=
                ((string *)&(field_local->super_Definition).file,(string *)&hash_2);
      std::__cxx11::string::~string((string *)&hash_2);
      break;
    case 7:
      pcVar5 = (char *)std::__cxx11::string::c_str();
      p_Var4 = FindHashFunction32(pcVar5);
      p_Stack_d0 = p_Var4;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_d4 = (*p_Var4)(pcVar5);
      NumToString<int>((string *)&hash_3,local_d4);
      std::__cxx11::string::operator=
                ((string *)&(field_local->super_Definition).file,(string *)&hash_3);
      std::__cxx11::string::~string((string *)&hash_3);
      break;
    case 8:
      pcVar5 = (char *)std::__cxx11::string::c_str();
      p_Var4 = FindHashFunction32(pcVar5);
      p_Stack_100 = p_Var4;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_104 = (*p_Var4)(pcVar5);
      NumToString<unsigned_int>((string *)&hash_4,local_104);
      std::__cxx11::string::operator=
                ((string *)&(field_local->super_Definition).file,(string *)&hash_4);
      std::__cxx11::string::~string((string *)&hash_4);
      break;
    case 9:
      pcVar5 = (char *)std::__cxx11::string::c_str();
      p_Var6 = FindHashFunction64(pcVar5);
      hashed_value_4 = (int64_t)p_Var6;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_138 = (*p_Var6)(pcVar5);
      NumToString<long>((string *)&hash_5,local_138);
      std::__cxx11::string::operator=
                ((string *)&(field_local->super_Definition).file,(string *)&hash_5);
      std::__cxx11::string::~string((string *)&hash_5);
      break;
    case 10:
      pcVar5 = (char *)std::__cxx11::string::c_str();
      p_Var6 = FindHashFunction64(pcVar5);
      hashed_value_5 = (uint64_t)p_Var6;
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_168 = (*p_Var6)(pcVar5);
      NumToString<unsigned_long>(&local_188,local_168);
      std::__cxx11::string::operator=
                ((string *)&(field_local->super_Definition).file,(string *)&local_188);
      std::__cxx11::string::~string((string *)&local_188);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                    ,0x7dd,"CheckedError flatbuffers::Parser::ParseHash(Value &, FieldDef *)");
    }
    Next(this);
    bVar1 = CheckedError::Check((CheckedError *)this);
    if (!bVar1) {
      CheckedError::~CheckedError((CheckedError *)this);
      anon_unknown_0::NoError();
    }
    return SUB82(this,0);
  }
  __assert_fail("field",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                ,0x7b6,"CheckedError flatbuffers::Parser::ParseHash(Value &, FieldDef *)");
}

Assistant:

CheckedError Parser::ParseHash(Value &e, FieldDef *field) {
  FLATBUFFERS_ASSERT(field);
  Value *hash_name = field->attributes.Lookup("hash");
  switch (e.type.base_type) {
    case BASE_TYPE_SHORT: {
      auto hash = FindHashFunction16(hash_name->constant.c_str());
      int16_t hashed_value = static_cast<int16_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_USHORT: {
      auto hash = FindHashFunction16(hash_name->constant.c_str());
      uint16_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_INT: {
      auto hash = FindHashFunction32(hash_name->constant.c_str());
      int32_t hashed_value = static_cast<int32_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_UINT: {
      auto hash = FindHashFunction32(hash_name->constant.c_str());
      uint32_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_LONG: {
      auto hash = FindHashFunction64(hash_name->constant.c_str());
      int64_t hashed_value = static_cast<int64_t>(hash(attribute_.c_str()));
      e.constant = NumToString(hashed_value);
      break;
    }
    case BASE_TYPE_ULONG: {
      auto hash = FindHashFunction64(hash_name->constant.c_str());
      uint64_t hashed_value = hash(attribute_.c_str());
      e.constant = NumToString(hashed_value);
      break;
    }
    default: FLATBUFFERS_ASSERT(0);
  }
  NEXT();
  return NoError();
}